

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_rust_punycode.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::anon_unknown_0::ConsumeOptionalAsciiPrefix
               (char **punycode_begin,char *punycode_end,char *out_begin,char *out_end,
               uint32_t *num_ascii_chars)

{
  char cVar1;
  uint32_t local_40;
  uint32_t uStack_3c;
  char c;
  int i;
  int last_underscore;
  uint32_t *num_ascii_chars_local;
  char *out_end_local;
  char *out_begin_local;
  char *punycode_end_local;
  char **punycode_begin_local;
  
  *num_ascii_chars = 0;
  uStack_3c = 0xffffffff;
  local_40 = 0;
  do {
    if ((long)punycode_end - (long)*punycode_begin <= (long)(int)local_40) {
      if ((int)uStack_3c < 0) {
        punycode_begin_local._7_1_ = true;
      }
      else if (uStack_3c == 0) {
        punycode_begin_local._7_1_ = false;
      }
      else if ((long)out_end - (long)out_begin < (long)(int)(uStack_3c + 1)) {
        punycode_begin_local._7_1_ = false;
      }
      else {
        *num_ascii_chars = uStack_3c;
        memcpy(out_begin,*punycode_begin,(ulong)*num_ascii_chars);
        out_begin[*num_ascii_chars] = '\0';
        *punycode_begin = *punycode_begin + (*num_ascii_chars + 1);
        punycode_begin_local._7_1_ = true;
      }
      return punycode_begin_local._7_1_;
    }
    cVar1 = (*punycode_begin)[(int)local_40];
    if (cVar1 == '_') {
      uStack_3c = local_40;
    }
    else if ((((cVar1 < 'a') || ('z' < cVar1)) && ((cVar1 < 'A' || ('Z' < cVar1)))) &&
            ((cVar1 < '0' || ('9' < cVar1)))) {
      return false;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

bool ConsumeOptionalAsciiPrefix(const char*& punycode_begin,
                                const char* const punycode_end,
                                char* const out_begin,
                                char* const out_end,
                                uint32_t& num_ascii_chars) {
  num_ascii_chars = 0;

  // Remember the last underscore if any.  Also use the same string scan to
  // reject any ASCII bytes that do not belong in an identifier, including NUL,
  // as well as non-ASCII bytes, which should have been delta-encoded instead.
  int last_underscore = -1;
  for (int i = 0; i < punycode_end - punycode_begin; ++i) {
    const char c = punycode_begin[i];
    if (c == '_') {
      last_underscore = i;
      continue;
    }
    // We write out the meaning of absl::ascii_isalnum rather than call that
    // function because its documentation does not promise it will remain
    // async-signal-safe under future development.
    if ('a' <= c && c <= 'z') continue;
    if ('A' <= c && c <= 'Z') continue;
    if ('0' <= c && c <= '9') continue;
    return false;
  }

  // If there was no underscore, that means there were no ASCII characters in
  // the plaintext, so there is no prefix to consume.  Our work is done.
  if (last_underscore < 0) return true;

  // Otherwise there will be an underscore delimiter somewhere.  It can't be
  // initial because then there would be no ASCII characters to its left, and no
  // delimiter would have been added in that case.
  if (last_underscore == 0) return false;

  // Any other position is reasonable.  Make sure there's room in the buffer.
  if (last_underscore + 1 > out_end - out_begin) return false;

  // Consume and write out the ASCII characters.
  num_ascii_chars = static_cast<uint32_t>(last_underscore);
  std::memcpy(out_begin, punycode_begin, num_ascii_chars);
  out_begin[num_ascii_chars] = '\0';
  punycode_begin += num_ascii_chars + 1;
  return true;
}